

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void DLevelScript::SetLineTexture(int lineid,int side,int position,int name)

{
  side_t *this;
  side_t *sidedef;
  FLineIdIterator itr;
  char *texname;
  int linenum;
  FTextureID texture;
  int name_local;
  int position_local;
  int side_local;
  int lineid_local;
  
  linenum = name;
  texture.texnum = position;
  FTextureID::FTextureID((FTextureID *)((long)&texname + 4));
  texname._0_4_ = -1;
  register0x00000000 = FBehavior::StaticLookupString(linenum);
  if (register0x00000000 != (char *)0x0) {
    itr.searchtag = (int)FTextureManager::GetTexture(&TexMan,register0x00000000,1,2);
    texname._4_4_ = (FTextureID)itr.searchtag;
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)((long)&sidedef + 4),lineid);
    while (texname._0_4_ = FLineIdIterator::Next((FLineIdIterator *)((long)&sidedef + 4)),
          -1 < (int)texname) {
      this = lines[(int)texname].sidedef[(int)(uint)(side != 0)];
      if (this != (side_t *)0x0) {
        if (texture.texnum == 0) {
          side_t::SetTexture(this,0,texname._4_4_);
        }
        else if (texture.texnum == 1) {
          side_t::SetTexture(this,1,texname._4_4_);
        }
        else if (texture.texnum == 2) {
          side_t::SetTexture(this,2,texname._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

void DLevelScript::SetLineTexture (int lineid, int side, int position, int name)
{
	FTextureID texture;
	int linenum = -1;
	const char *texname = FBehavior::StaticLookupString (name);

	if (texname == NULL)
		return;

	side = !!side;

	texture = TexMan.GetTexture (texname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

	FLineIdIterator itr(lineid);
	while ((linenum = itr.Next()) >= 0)
	{
		side_t *sidedef;

		sidedef = lines[linenum].sidedef[side];
		if (sidedef == NULL)
			continue;

		switch (position)
		{
		case TEXTURE_TOP:
			sidedef->SetTexture(side_t::top, texture);
			break;
		case TEXTURE_MIDDLE:
			sidedef->SetTexture(side_t::mid, texture);
			break;
		case TEXTURE_BOTTOM:
			sidedef->SetTexture(side_t::bottom, texture);
			break;
		default:
			break;
		}

	}
}